

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::Fixed64CasesWithSizes_ReadLittleEndian64_Test::TestBody
          (Fixed64CasesWithSizes_ReadLittleEndian64_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  char *pcVar3;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  AssertionResult gtest_ar_;
  AssertHelper local_c8;
  AssertionResult gtest_ar;
  uint64_t value;
  Fixed64Case kFixed64Cases_case;
  CodedInputStream coded_input;
  ArrayInputStream input;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
           ::GetParam();
  kFixed64Cases_case.bytes =
       *&(pPVar2->
         super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>).
         super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_false>.
         _M_head_impl.bytes;
  kFixed64Cases_case.value =
       (pPVar2->
       super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>).
       super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_false>.
       _M_head_impl.value;
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
           ::GetParam();
  io::(anonymous_namespace)::CodedStreamTest::buffer_ = kFixed64Cases_case.bytes[0];
  DAT_01711951 = kFixed64Cases_case.bytes[1];
  DAT_01711952 = kFixed64Cases_case.bytes[2];
  DAT_01711953 = kFixed64Cases_case.bytes[3];
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._3_1_ = kFixed64Cases_case.bytes[4];
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._4_1_ = kFixed64Cases_case.bytes[5];
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._5_1_ = kFixed64Cases_case.bytes[6];
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._6_1_ = kFixed64Cases_case.bytes[7];
  ArrayInputStream::ArrayInputStream
            (&input,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,
             (pPVar2->
             super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>).
             super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  CodedInputStream::CodedInputStream(&coded_input,&input.super_ZeroCopyInputStream);
  bVar1 = CodedInputStream::ReadLittleEndian64(&coded_input,&value);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"coded_input.ReadLittleEndian64(&value)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x26e,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"kFixed64Cases_case.value","value",&kFixed64Cases_case.value,
             &value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x26f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  CodedInputStream::~CodedInputStream(&coded_input);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  gtest_ar_._0_8_ = ArrayInputStream::ByteCount(&input);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)&coded_input,"sizeof(uint64_t)","input.ByteCount()",
             (unsigned_long *)&gtest_ar,(long *)&gtest_ar_);
  if ((char)coded_input.buffer_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (coded_input.buffer_end_ == (uint8_t *)0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)coded_input.buffer_end_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x272,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&coded_input.buffer_end_);
  return;
}

Assistant:

TEST_P(Fixed64CasesWithSizes, ReadLittleEndian64) {
  Fixed64Case kFixed64Cases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kFixed64Cases_case.bytes, sizeof(kFixed64Cases_case.bytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint64_t value;
    EXPECT_TRUE(coded_input.ReadLittleEndian64(&value));
    EXPECT_EQ(kFixed64Cases_case.value, value);
  }

  EXPECT_EQ(sizeof(uint64_t), input.ByteCount());
}